

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Z1.c
# Opt level: O3

void test_Z1(void)

{
  wchar_t wVar1;
  
  extract_reference_file("test_basic.zip");
  wVar1 = systemf("%s -Z1 %s >test.out 2>test.err",testprog,"test_basic.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_Z1.c"
                      ,L'\x11',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_Z1.c"
             ,L'\x12',"test.out");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_Z1.c"
             ,L'\x13',"test_basic/\ntest_basic/a\ntest_basic/b\ntest_basic/c\ntest_basic/CAPS\n",
             "test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_Z1.c"
             ,L'\x14',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_Z1)
{
	const char *reffile = "test_basic.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s -Z1 %s >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertTextFileContents("test_basic/\ntest_basic/a\ntest_basic/b\ntest_basic/c\ntest_basic/CAPS\n", "test.out");
	assertEmptyFile("test.err");
}